

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

void writeModelSolution(FILE *file,HighsLogOptions *log_options,HighsModel *model,
                       HighsSolution *solution,HighsInfo *info,bool sparse)

{
  size_type sVar1;
  ostream *poVar2;
  const_reference pvVar3;
  undefined8 uVar4;
  pointer pvVar5;
  FILE *file_00;
  byte *in_RCX;
  uint *in_RDX;
  string *in_RSI;
  double in_RDI;
  long in_R8;
  byte in_R9B;
  string name_2;
  array<char,_32UL> valStr_2;
  HighsInt ix_2;
  string name_1;
  array<char,_32UL> valStr_1;
  HighsInt ix_1;
  string name;
  array<char,_32UL> valStr;
  HighsInt ix;
  stringstream ss;
  bool have_dual;
  bool have_primal;
  bool have_row_names;
  bool have_col_names;
  HighsLp *lp;
  string *in_stack_fffffffffffff7b0;
  string *s;
  HighsLogOptions *in_stack_fffffffffffff7b8;
  HighsLogOptions *log_options_;
  FILE *in_stack_fffffffffffff7c0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff7d8;
  HighsModel *in_stack_fffffffffffff7e0;
  HighsLogOptions *in_stack_fffffffffffff7e8;
  FILE *in_stack_fffffffffffff7f0;
  allocator *in_stack_fffffffffffff868;
  double in_stack_fffffffffffff870;
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [68];
  int local_5cc;
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [15];
  undefined1 in_stack_fffffffffffffb07;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb08;
  HighsLp *in_stack_fffffffffffffb10;
  HighsLogOptions *in_stack_fffffffffffffb18;
  FILE *in_stack_fffffffffffffb20;
  int local_4a4;
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [39];
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [24];
  string local_340 [32];
  string local_320 [68];
  int local_2dc;
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  undefined4 local_278;
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [55];
  allocator local_1e9;
  string local_1e8 [32];
  stringstream local_1c8 [16];
  ostream local_1b8;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  uint *local_38;
  byte local_29;
  long local_28;
  byte *local_20;
  string *local_10;
  double local_8;
  
  local_29 = in_R9B & 1;
  local_38 = in_RDX;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDX + 0x52));
  local_39 = sVar1 != 0;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_38 + 0x58));
  local_3a = sVar1 != 0;
  local_3b = *local_20 & 1;
  local_3c = local_20[1] & 1;
  std::__cxx11::stringstream::stringstream(local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"\n# Primal solution values\n",&local_1e9);
  highsFprintfString(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  if (((local_3b & 1) == 0) || (*(int *)(local_28 + 0x2c) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"None\n",&local_221);
    highsFprintfString(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0
                      );
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
  }
  else {
    if (*(int *)(local_28 + 0x2c) == 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_248,"Feasible\n",&local_249);
      highsFprintfString(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                         in_stack_fffffffffffff7b0);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_270,"Infeasible\n",&local_271);
      highsFprintfString(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                         in_stack_fffffffffffff7b0);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
    }
    writeModelObjective(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                        in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
    writePrimalSolution(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                        in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                        (bool)in_stack_fffffffffffffb07);
    if ((local_29 & 1) != 0) {
      local_278 = 1;
      goto LAB_0050afdc;
    }
    std::__cxx11::string::string(local_298);
    std::__cxx11::stringstream::str((string *)local_1c8);
    std::__cxx11::string::~string(local_298);
    highsFormatToString_abi_cxx11_((char *)local_2b8,"# Rows %d\n",(ulong)local_38[1]);
    std::operator<<(&local_1b8,local_2b8);
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::stringstream::str();
    highsFprintfString(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0
                      );
    std::__cxx11::string::~string(local_2d8);
    for (local_2dc = 0; local_2dc < (int)local_38[1]; local_2dc = local_2dc + 1) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(local_20 + 0x38),(long)local_2dc);
      highsDoubleToString(in_stack_fffffffffffff870,(double)in_stack_fffffffffffff868);
      std::__cxx11::string::string(local_320);
      std::__cxx11::stringstream::str((string *)local_1c8);
      std::__cxx11::string::~string(local_320);
      poVar2 = std::operator<<(&local_1b8,"R");
      std::ostream::operator<<(poVar2,local_2dc);
      if ((local_3a & 1) == 0) {
        std::__cxx11::stringstream::str();
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(local_38 + 0x58),(long)local_2dc);
        std::__cxx11::string::string(local_340,(string *)pvVar3);
      }
      std::__cxx11::string::string(local_360);
      std::__cxx11::stringstream::str((string *)local_1c8);
      std::__cxx11::string::~string(local_360);
      uVar4 = std::__cxx11::string::c_str();
      pvVar5 = std::array<char,_32UL>::data((array<char,_32UL> *)0x50a1e0);
      highsFormatToString_abi_cxx11_((char *)local_380,"%-s %s\n",uVar4,pvVar5);
      std::operator<<(&local_1b8,local_380);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::stringstream::str();
      highsFprintfString(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                         in_stack_fffffffffffff7b0);
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::string::~string(local_340);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"\n# Dual solution values\n",&local_3c1);
  highsFprintfString(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  if (((local_3c & 1) == 0) || (*(int *)(local_28 + 0x30) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e8,"None\n",&local_3e9);
    highsFprintfString(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0
                      );
    std::__cxx11::string::~string(local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  }
  else {
    if (*(int *)(local_28 + 0x30) == 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_410,"Feasible\n",&local_411);
      highsFprintfString(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                         in_stack_fffffffffffff7b0);
      std::__cxx11::string::~string(local_410);
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
      in_stack_fffffffffffff870 = local_8;
    }
    else {
      in_stack_fffffffffffff868 = &local_439;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_438,"Infeasible\n",in_stack_fffffffffffff868);
      highsFprintfString(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                         in_stack_fffffffffffff7b0);
      std::__cxx11::string::~string(local_438);
      std::allocator<char>::~allocator((allocator<char> *)&local_439);
    }
    std::__cxx11::string::string(local_460);
    std::__cxx11::stringstream::str((string *)local_1c8);
    std::__cxx11::string::~string(local_460);
    highsFormatToString_abi_cxx11_((char *)local_480,"# Columns %d\n",(ulong)*local_38);
    std::operator<<(&local_1b8,local_480);
    std::__cxx11::string::~string(local_480);
    std::__cxx11::stringstream::str();
    highsFprintfString(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0
                      );
    std::__cxx11::string::~string(local_4a0);
    for (local_4a4 = 0; local_4a4 < (int)*local_38; local_4a4 = local_4a4 + 1) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),(long)local_4a4);
      highsDoubleToString(in_stack_fffffffffffff870,(double)in_stack_fffffffffffff868);
      std::__cxx11::string::string((string *)&stack0xfffffffffffffb18);
      std::__cxx11::stringstream::str((string *)local_1c8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffb18);
      poVar2 = std::operator<<(&local_1b8,"C");
      std::ostream::operator<<(poVar2,local_4a4);
      if ((local_39 & 1) == 0) {
        std::__cxx11::stringstream::str();
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(local_38 + 0x52),(long)local_4a4);
        std::__cxx11::string::string(local_508,(string *)pvVar3);
      }
      std::__cxx11::string::string(local_528);
      std::__cxx11::stringstream::str((string *)local_1c8);
      std::__cxx11::string::~string(local_528);
      uVar4 = std::__cxx11::string::c_str();
      pvVar5 = std::array<char,_32UL>::data((array<char,_32UL> *)0x50a9cb);
      highsFormatToString_abi_cxx11_((char *)local_548,"%-s %s\n",uVar4,pvVar5);
      std::operator<<(&local_1b8,local_548);
      std::__cxx11::string::~string(local_548);
      std::__cxx11::stringstream::str();
      highsFprintfString(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                         in_stack_fffffffffffff7b0);
      std::__cxx11::string::~string(local_568);
      std::__cxx11::string::~string(local_508);
    }
    std::__cxx11::string::string(local_588);
    std::__cxx11::stringstream::str((string *)local_1c8);
    std::__cxx11::string::~string(local_588);
    poVar2 = &local_1b8;
    highsFormatToString_abi_cxx11_((char *)local_5a8,"# Rows %d\n",(ulong)local_38[1]);
    std::operator<<(poVar2,local_5a8);
    std::__cxx11::string::~string(local_5a8);
    std::__cxx11::stringstream::str();
    highsFprintfString(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0
                      );
    std::__cxx11::string::~string(local_5c8);
    for (local_5cc = 0; local_5cc < (int)local_38[1]; local_5cc = local_5cc + 1) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(local_20 + 0x50),(long)local_5cc);
      highsDoubleToString(in_stack_fffffffffffff870,(double)in_stack_fffffffffffff868);
      std::__cxx11::string::string(local_610);
      std::__cxx11::stringstream::str((string *)local_1c8);
      std::__cxx11::string::~string(local_610);
      poVar2 = std::operator<<(&local_1b8,"R");
      std::ostream::operator<<(poVar2,local_5cc);
      if ((local_3a & 1) == 0) {
        std::__cxx11::stringstream::str();
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(local_38 + 0x58),(long)local_5cc);
        std::__cxx11::string::string(local_630,(string *)pvVar3);
      }
      std::__cxx11::string::string(local_650);
      std::__cxx11::stringstream::str((string *)local_1c8);
      std::__cxx11::string::~string(local_650);
      log_options_ = (HighsLogOptions *)&local_1b8;
      file_00 = (FILE *)std::__cxx11::string::c_str();
      pvVar5 = std::array<char,_32UL>::data((array<char,_32UL> *)0x50adf2);
      highsFormatToString_abi_cxx11_((char *)local_670,"%-s %s\n",file_00,pvVar5);
      std::operator<<((ostream *)log_options_,local_670);
      std::__cxx11::string::~string(local_670);
      s = local_10;
      std::__cxx11::stringstream::str();
      highsFprintfString(file_00,log_options_,s);
      std::__cxx11::string::~string(local_690);
      std::__cxx11::string::~string(local_630);
    }
  }
  local_278 = 0;
LAB_0050afdc:
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return;
}

Assistant:

void writeModelSolution(FILE* file, const HighsLogOptions& log_options,
                        const HighsModel& model, const HighsSolution& solution,
                        const HighsInfo& info, const bool sparse) {
  const HighsLp& lp = model.lp_;
  const bool have_col_names = lp.col_names_.size() > 0;
  const bool have_row_names = lp.row_names_.size() > 0;
  const bool have_primal = solution.value_valid;
  const bool have_dual = solution.dual_valid;
  if (have_col_names) assert((int)lp.col_names_.size() >= lp.num_col_);
  if (have_row_names) assert((int)lp.row_names_.size() >= lp.num_row_);
  if (have_primal) {
    assert((int)solution.col_value.size() >= lp.num_col_);
    assert((int)solution.row_value.size() >= lp.num_row_);
    assert(info.primal_solution_status != kSolutionStatusNone);
  }
  if (have_dual) {
    assert((int)solution.col_dual.size() >= lp.num_col_);
    assert((int)solution.row_dual.size() >= lp.num_row_);
    assert(info.dual_solution_status != kSolutionStatusNone);
  }
  std::stringstream ss;
  highsFprintfString(file, log_options, "\n# Primal solution values\n");
  if (!have_primal || info.primal_solution_status == kSolutionStatusNone) {
    highsFprintfString(file, log_options, "None\n");
  } else {
    if (info.primal_solution_status == kSolutionStatusFeasible) {
      highsFprintfString(file, log_options, "Feasible\n");
    } else {
      assert(info.primal_solution_status == kSolutionStatusInfeasible);
      highsFprintfString(file, log_options, "Infeasible\n");
    }
    writeModelObjective(file, log_options, model, solution.col_value);
    writePrimalSolution(file, log_options, model.lp_, solution.col_value,
                        sparse);
    if (sparse) return;
    ss.str(std::string());
    ss << highsFormatToString("# Rows %" HIGHSINT_FORMAT "\n", lp.num_row_);
    highsFprintfString(file, log_options, ss.str());
    for (HighsInt ix = 0; ix < lp.num_row_; ix++) {
      auto valStr = highsDoubleToString(solution.row_value[ix],
                                        kHighsSolutionValueToStringTolerance);
      // Create a row name
      ss.str(std::string());
      ss << "R" << ix;
      const std::string name = have_row_names ? lp.row_names_[ix] : ss.str();
      ss.str(std::string());
      ss << highsFormatToString("%-s %s\n", name.c_str(), valStr.data());
      highsFprintfString(file, log_options, ss.str());
    }
  }
  highsFprintfString(file, log_options, "\n# Dual solution values\n");
  if (!have_dual || info.dual_solution_status == kSolutionStatusNone) {
    highsFprintfString(file, log_options, "None\n");
  } else {
    if (info.dual_solution_status == kSolutionStatusFeasible) {
      highsFprintfString(file, log_options, "Feasible\n");
    } else {
      assert(info.dual_solution_status == kSolutionStatusInfeasible);
      highsFprintfString(file, log_options, "Infeasible\n");
    }
    ss.str(std::string());
    ss << highsFormatToString("# Columns %" HIGHSINT_FORMAT "\n", lp.num_col_);
    highsFprintfString(file, log_options, ss.str());
    for (HighsInt ix = 0; ix < lp.num_col_; ix++) {
      auto valStr = highsDoubleToString(solution.col_dual[ix],
                                        kHighsSolutionValueToStringTolerance);
      ss.str(std::string());
      ss << "C" << ix;
      const std::string name = have_col_names ? lp.col_names_[ix] : ss.str();
      ss.str(std::string());
      ss << highsFormatToString("%-s %s\n", name.c_str(), valStr.data());
      highsFprintfString(file, log_options, ss.str());
    }
    ss.str(std::string());
    ss << highsFormatToString("# Rows %" HIGHSINT_FORMAT "\n", lp.num_row_);
    highsFprintfString(file, log_options, ss.str());
    for (HighsInt ix = 0; ix < lp.num_row_; ix++) {
      auto valStr = highsDoubleToString(solution.row_dual[ix],
                                        kHighsSolutionValueToStringTolerance);
      ss.str(std::string());
      ss << "R" << ix;
      const std::string name = have_row_names ? lp.row_names_[ix] : ss.str();
      ss.str(std::string());
      ss << highsFormatToString("%-s %s\n", name.c_str(), valStr.data());
      highsFprintfString(file, log_options, ss.str());
    }
  }
}